

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::AddString
          (TextFormatDecodeData *this,int32 key,string *input_for_decode,string *desired_output)

{
  pointer ppVar1;
  ostream *poVar2;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  ppVar1 = (this->entries_).
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar1 == (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      DecodeDataForString(&local_48,input_for_decode,desired_output);
      local_70._0_4_ = key;
      local_68._M_p = (pointer)&local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_48._M_dataplus._M_p,
                 local_48._M_dataplus._M_p + local_48._M_string_length);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)this,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    if (ppVar1->first == key) break;
    ppVar1 = ppVar1 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: duplicate key (");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,key);
  poVar2 = std::operator<<(poVar2,") making TextFormat data, input: \"");
  poVar2 = std::operator<<(poVar2,(string *)input_for_decode);
  poVar2 = std::operator<<(poVar2,"\", desired: \"");
  poVar2 = std::operator<<(poVar2,(string *)desired_output);
  poVar2 = std::operator<<(poVar2,"\".");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  abort();
}

Assistant:

void TextFormatDecodeData::AddString(int32 key,
                                     const string& input_for_decode,
                                     const string& desired_output) {
  for (vector<DataEntry>::const_iterator i = entries_.begin();
       i != entries_.end(); ++i) {
    if (i->first == key) {
      cerr << "error: duplicate key (" << key
           << ") making TextFormat data, input: \"" << input_for_decode
           << "\", desired: \"" << desired_output << "\"." << endl;
      cerr.flush();
      abort();
    }
  }

  const string& data = TextFormatDecodeData::DecodeDataForString(
      input_for_decode, desired_output);
  entries_.push_back(DataEntry(key, data));
}